

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::srv_config::serialize(srv_config *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<buffer> pVar1;
  string *in_stack_00000008;
  buffer *in_stack_00000010;
  ptr<buffer> *buf;
  size_t in_stack_00000108;
  size_t in_stack_ffffffffffffffd8;
  buffer *in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffec;
  uint val;
  
  val = (uint)in_stack_ffffffffffffffec;
  std::__cxx11::string::length();
  std::__cxx11::string::length();
  buffer::alloc(in_stack_00000108);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b463);
  buffer::put(in_RSI,val);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b47e);
  buffer::put(in_RSI,val);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b49a);
  buffer::put(in_stack_00000010,in_stack_00000008);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b4b7);
  buffer::put(in_stack_00000010,in_stack_00000008);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b4d4);
  buffer::put(in_RSI,(byte)(val >> 0x18));
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b4f4);
  buffer::put(in_RSI,val);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b510);
  buffer::pos(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> srv_config::serialize() const{
    ptr<buffer> buf = buffer::alloc(
        sz_int +
        sz_int +
        (endpoint_.length()+1) +
        (aux_.length()+1) +
        1 +
        sz_int
    );
    buf->put(id_);
    buf->put(dc_id_);
    buf->put(endpoint_);
    buf->put(aux_);
    buf->put((byte)(learner_?(1):(0)));
    buf->put(priority_);
    buf->pos(0);
    return buf;
}